

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O1

char * utf8_fskip(char *s,size_t n,char *lim)

{
  char cVar1;
  
  cVar1 = *s;
  while( true ) {
    if (cVar1 == '\0') {
      if (n != 0) {
        s = (char *)0x0;
      }
      return s;
    }
    if (n == 0) break;
    n = n - 1;
    if (s == lim) {
      return (char *)0x0;
    }
    cVar1 = s[1];
    s = s + 1;
  }
  return s;
}

Assistant:

char *utf8_fskip(char *s, size_t n, char *lim)
{
	while (1) {
		if (*s == 0) {
			/* Reached the end of the input. */
			return (n > 0) ? NULL : s;
		}
		if ((*s & 0xc0) != 0x80) {
			/* It's not marked as a continuation byte. */
			if (n == 0) {
				return s;
			}
			--n;
		}
		if (s == lim) {
			return NULL;
		}
		++s;
	}
}